

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
finishedWithValue(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,string *name)

{
  bool bVar1;
  _Self local_40 [3];
  _Self local_28;
  iterator fnd;
  lock_guard<std::mutex> lock;
  string *name_local;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&fnd,&this->promiseLock);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::find(&this->usedPromiseByString,name);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(&this->usedPromiseByString);
  bVar1 = std::operator!=(&local_28,local_40);
  if (bVar1) {
    std::
    map<std::__cxx11::string,std::promise<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,std::promise<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::promise<std::__cxx11::string>>>>
                        *)&this->usedPromiseByString,(iterator)local_28._M_node);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&fnd);
  return;
}

Assistant:

void finishedWithValue(const std::string& name)
    {
        std::lock_guard<std::mutex> lock(promiseLock);
        auto fnd = usedPromiseByString.find(name);
        if (fnd != usedPromiseByString.end()) {
            usedPromiseByString.erase(fnd);
        }
    }